

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configfile.cpp
# Opt level: O2

void __thiscall FConfigFile::ClearKey(FConfigFile *this,char *key)

{
  FConfigEntry *pFVar1;
  FConfigEntry **ppFVar2;
  int iVar3;
  FConfigEntry **ppFVar4;
  FConfigEntry *pFVar5;
  
  pFVar1 = this->CurrentSection->RootEntry;
  if (pFVar1 != (FConfigEntry *)0x0) {
    ppFVar2 = &this->CurrentSection->RootEntry;
    while (pFVar5 = pFVar1, ppFVar4 = ppFVar2, pFVar5 != (FConfigEntry *)0x0) {
      iVar3 = strcasecmp(pFVar5->Key,key);
      ppFVar2 = &pFVar5->Next;
      pFVar1 = pFVar5->Next;
      if (iVar3 == 0) {
        *ppFVar4 = pFVar5->Next;
        if (this->CurrentSection->LastEntryPtr == &pFVar5->Next) {
          this->CurrentSection->LastEntryPtr = ppFVar4;
        }
        if (pFVar5->Value != (char *)0x0) {
          operator_delete__(pFVar5->Value);
        }
        operator_delete__(pFVar5);
        return;
      }
    }
  }
  return;
}

Assistant:

void FConfigFile::ClearKey(const char *key)
{
	if (CurrentSection->RootEntry == NULL)
	{
		return;
	}
	FConfigEntry **prober = &CurrentSection->RootEntry, *probe = *prober;

	while (probe != NULL && stricmp(probe->Key, key) != 0)
	{
		prober = &probe->Next;
		probe = *prober;
	}
	if (probe != NULL)
	{
		*prober = probe->Next;
		if (CurrentSection->LastEntryPtr == &probe->Next)
		{
			CurrentSection->LastEntryPtr = prober;
		}
		delete[] probe->Value;
		delete[] (char *)probe;
	}
}